

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::insertParagraphSeparator(QWidgetTextControlPrivate *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  QTextCursor *pQVar6;
  long in_FS_OFFSET;
  QTextFormat aQStack_a8 [16];
  QTextFormat local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [24];
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = &this->cursor;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  QTextFormat::clearProperty((int)local_68);
  cVar2 = QTextFormat::hasProperty((int)local_68);
  if (cVar2 != '\0') {
    QTextFormat::clearProperty((int)local_68);
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_50);
    QTextFormat::operator=((QTextFormat *)&local_78,(QTextFormat *)local_50.data);
    QTextFormat::~QTextFormat((QTextFormat *)local_50.data);
  }
  lVar5 = QTextCursor::currentList();
  if (lVar5 != 0) {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat();
    QTextFormat::clearProperty((int)&local_88);
    QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar6);
    iVar4 = QTextFormat::intProperty((int)local_68);
    if (iVar4 == 2) {
      ::QVariant::QVariant((QVariant *)&local_50,1);
      QTextFormat::setProperty((int)local_68,(QVariant *)0x10a0);
      ::QVariant::~QVariant((QVariant *)&local_50);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
  }
  QTextCursor::block();
  QTextBlock::text();
  if (local_50._16_8_ == 0) {
    QTextCursor::blockFormat();
    cVar2 = QTextFormat::hasProperty((int)local_98);
    if (cVar2 != '\0') goto LAB_004cc44c;
    QTextCursor::blockFormat();
    bVar3 = QTextFormat::hasProperty((int)aQStack_a8);
    bVar3 = bVar3 ^ 1;
    bVar1 = true;
  }
  else {
LAB_004cc44c:
    bVar1 = false;
    bVar3 = 0;
  }
  if (bVar1) {
    QTextFormat::~QTextFormat(aQStack_a8);
  }
  if (local_50._16_8_ == 0) {
    QTextFormat::~QTextFormat(local_98);
  }
  if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50.shared = *(int *)local_50.shared + -1;
    UNLOCK();
    if (*(int *)local_50.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
    }
  }
  if (bVar3 != 0) {
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_50.data);
    QTextFormat::operator=((QTextFormat *)local_68,(QTextFormat *)local_50.data);
    QTextFormat::~QTextFormat((QTextFormat *)local_50.data);
    QTextCursor::blockFormat();
    cVar2 = QTextFormat::operator==((QTextFormat *)local_50.data,(QTextFormat *)local_68);
    QTextFormat::~QTextFormat((QTextFormat *)local_50.data);
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_50);
    QTextFormat::operator=((QTextFormat *)&local_78,(QTextFormat *)local_50.data);
    QTextFormat::~QTextFormat((QTextFormat *)local_50.data);
    QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar6);
    QTextCursor::setCharFormat((QTextCharFormat *)pQVar6);
    if (cVar2 == '\0') goto LAB_004cc533;
  }
  QTextCursor::insertBlock((QTextBlockFormat *)pQVar6,(QTextCharFormat *)local_68);
LAB_004cc533:
  QTextFormat::~QTextFormat((QTextFormat *)&local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::insertParagraphSeparator()
{
    // clear blockFormat properties that the user is unlikely to want duplicated:
    // - don't insert <hr/> automatically
    // - the next paragraph after a heading should be a normal paragraph
    // - remove the bottom margin from the last list item before appending
    // - the next checklist item after a checked item should be unchecked
    auto blockFmt = cursor.blockFormat();
    auto charFmt = cursor.charFormat();
    blockFmt.clearProperty(QTextFormat::BlockTrailingHorizontalRulerWidth);
    if (blockFmt.hasProperty(QTextFormat::HeadingLevel)) {
        blockFmt.clearProperty(QTextFormat::HeadingLevel);
        charFmt = QTextCharFormat();
    }
    if (cursor.currentList()) {
        auto existingFmt = cursor.blockFormat();
        existingFmt.clearProperty(QTextBlockFormat::BlockBottomMargin);
        cursor.setBlockFormat(existingFmt);
        if (blockFmt.marker() == QTextBlockFormat::MarkerType::Checked)
            blockFmt.setMarker(QTextBlockFormat::MarkerType::Unchecked);
    }

    // After a blank line, reset block and char formats. I.e. you can end a list,
    // block quote, etc. by hitting enter twice, and get back to normal paragraph style.
    if (cursor.block().text().isEmpty() &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth) &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockCodeLanguage)) {
        blockFmt = QTextBlockFormat();
        const bool blockFmtChanged = (cursor.blockFormat() != blockFmt);
        charFmt = QTextCharFormat();
        cursor.setBlockFormat(blockFmt);
        cursor.setCharFormat(charFmt);
        // If the user hit enter twice just to get back to default format,
        // don't actually insert a new block. But if the user then hits enter
        // yet again, the block format will not change, so we will insert a block.
        // This is what many word processors do.
        if (blockFmtChanged)
            return;
    }

    cursor.insertBlock(blockFmt, charFmt);
}